

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-amiga.cc
# Opt level: O3

PSpriteAmiga __thiscall
DataSourceAmiga::SpriteAmiga::merge_horizontaly(SpriteAmiga *this,PSpriteAmiga *right)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _func_int *p_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  _func_int *p_Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  element_type *peVar7;
  long lVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  PSpriteAmiga PVar10;
  undefined1 local_29;
  _func_int *local_28;
  
  if ((element_type *)in_RDX->_vptr__Sp_counted_base[6] ==
      right[3].super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  {
    local_28 = (_func_int *)
               ((long)&(right[2].
                        super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_vptr__Sp_counted_base +
               (long)in_RDX->_vptr__Sp_counted_base[5]);
    std::__shared_ptr<DataSourceAmiga::SpriteAmiga,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<DataSourceAmiga::SpriteAmiga>,unsigned_long,unsigned_long&>
              ((__shared_ptr<DataSourceAmiga::SpriteAmiga,(__gnu_cxx::_Lock_policy)2> *)this,
               (allocator<DataSourceAmiga::SpriteAmiga> *)&local_29,(unsigned_long *)&local_28,
               (unsigned_long *)(right + 3));
    peVar1 = right[3].super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    _Var4._M_pi = extraout_RDX;
    if (peVar1 != (element_type *)0x0) {
      p_Var3 = (this->super_SpriteBase).super_Sprite._vptr_Sprite[7];
      _Var4._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    in_RDX->_vptr__Sp_counted_base[5];
      p_Var5 = in_RDX->_vptr__Sp_counted_base[7];
      p_Var2 = right[2].super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
      p_Var6 = right[3].super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
      peVar7 = (element_type *)0x0;
      do {
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          lVar8 = 0;
          p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          do {
            *(undefined4 *)(p_Var3 + (long)p_Var9 * 4) =
                 *(undefined4 *)((long)&p_Var6->_vptr__Sp_counted_base + (long)p_Var9 * 4);
            p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&p_Var9->_vptr__Sp_counted_base + 1);
            lVar8 = lVar8 + -4;
          } while (p_Var2 != p_Var9);
          p_Var3 = p_Var3 + -lVar8;
          p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)p_Var6 - lVar8);
        }
        if (_Var4._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          lVar8 = 0;
          p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          do {
            *(undefined4 *)(p_Var3 + (long)p_Var9 * 4) = *(undefined4 *)(p_Var5 + (long)p_Var9 * 4);
            p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&p_Var9->_vptr__Sp_counted_base + 1);
            lVar8 = lVar8 + -4;
          } while (_Var4._M_pi != p_Var9);
          p_Var3 = p_Var3 + -lVar8;
          p_Var5 = p_Var5 + -lVar8;
        }
        peVar7 = (element_type *)((long)&(peVar7->super_SpriteBase).super_Sprite._vptr_Sprite + 1);
      } while (peVar7 != peVar1);
    }
  }
  else {
    (this->super_SpriteBase).super_Sprite._vptr_Sprite = (_func_int **)0x0;
    (this->super_SpriteBase).super_Sprite.super_enable_shared_from_this<Data::Sprite>._M_weak_this.
    super___weak_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    _Var4._M_pi = in_RDX;
  }
  PVar10.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var4._M_pi;
  PVar10.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (PSpriteAmiga)
         PVar10.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

DataSourceAmiga::PSpriteAmiga
DataSourceAmiga::SpriteAmiga::merge_horizontaly(PSpriteAmiga right) {
  if (right->height != height) {
    return nullptr;
  }

  PSpriteAmiga result = std::make_shared<SpriteAmiga>(width + right->width,
                                                      height);

  uint32_t *src_l = reinterpret_cast<uint32_t*>(data);
  uint32_t *src_r = reinterpret_cast<uint32_t*>(right->data);
  uint32_t *res = reinterpret_cast<uint32_t*>(result->data);
  for (size_t y = 0; y < height; y++) {
    for (size_t x = 0; x < width; x++) {
      *res++ = *src_l++;
    }
    for (size_t x = 0; x < right->width; x++) {
      *res++ = *src_r++;
    }
  }

  return result;
}